

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O0

void __thiscall QMenuPrivate::updateActionRects(QMenuPrivate *this,QRect *screen)

{
  bool bVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  QMenu *pQVar12;
  QStyle *pQVar13;
  qsizetype qVar14;
  const_reference ppQVar15;
  ulong uVar16;
  uint *puVar17;
  QStyle *pQVar18;
  QWidget *pQVar19;
  uint *puVar20;
  int *piVar21;
  reference pQVar22;
  long lVar23;
  QStyleOptionMenuItem *pQVar24;
  QMenuPrivate *in_RDI;
  long in_FS_OFFSET;
  undefined1 auVar25 [16];
  QWidget *widget;
  QRect *rect;
  int i_2;
  int x;
  int sfcMargin;
  qsizetype t;
  QWidget *w;
  QFontMetrics *fm;
  bool isPlainSeparator;
  bool isSection;
  int i_1;
  bool menuSupportsSections;
  bool contextMenu;
  bool previousWasSeparator;
  int i;
  int y;
  int column_max_y;
  int base_y;
  int tearoffHeight;
  int deskFw;
  int fw;
  int icone;
  int vmargin;
  int hmargin;
  QStyle *style;
  int lastVisibleAction;
  QMenu *q;
  int min_column_width;
  QSize is_sz;
  QIcon is_1;
  QKeySequence seq;
  QString s;
  QSize sz;
  QAction *action_1;
  QFontMetrics qfm;
  QIcon is;
  QAction *action;
  int max_column_width;
  QStyleOptionMenuItem opt_1;
  QStyleOption opt;
  int in_stack_fffffffffffffc58;
  CaseSensitivity in_stack_fffffffffffffc5c;
  QStyleOptionMenuItem *in_stack_fffffffffffffc60;
  QRect *in_stack_fffffffffffffc68;
  QHash<QAction_*,_QWidget_*> *this_00;
  int in_stack_fffffffffffffc70;
  int in_stack_fffffffffffffc74;
  QStyleOption *in_stack_fffffffffffffc78;
  undefined4 in_stack_fffffffffffffc88;
  undefined2 in_stack_fffffffffffffc8c;
  QChar in_stack_fffffffffffffc8e;
  int in_stack_fffffffffffffc90;
  int in_stack_fffffffffffffc94;
  QWidget *in_stack_fffffffffffffc98;
  QWidget *pQVar26;
  undefined1 in_stack_fffffffffffffca0;
  undefined1 in_stack_fffffffffffffca1;
  undefined1 in_stack_fffffffffffffca2;
  undefined1 in_stack_fffffffffffffca3;
  undefined1 in_stack_fffffffffffffca4;
  byte bVar27;
  undefined1 in_stack_fffffffffffffca5;
  undefined1 in_stack_fffffffffffffca6;
  undefined1 in_stack_fffffffffffffca7;
  int local_34c;
  int local_344;
  qsizetype in_stack_fffffffffffffcd8;
  int local_314;
  bool local_2e3;
  int local_2e0;
  byte local_2d9;
  int local_2d8;
  int local_2d4;
  int local_288;
  undefined1 local_284 [8];
  undefined8 local_27c;
  undefined8 local_274;
  undefined8 local_26c;
  int local_264;
  QSize local_260;
  undefined1 *local_258;
  QIcon local_250;
  int local_248;
  int local_244;
  undefined1 local_240 [16];
  undefined1 local_230 [16];
  undefined1 local_220 [24];
  int local_208;
  uint local_204;
  undefined1 *local_200 [4];
  undefined1 local_1e0 [28];
  int local_1c4;
  uint local_1c0;
  QChar local_1ba;
  undefined1 *local_1b8;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  QSize local_1a0;
  QSize local_180;
  undefined8 local_178;
  QSize local_170;
  undefined8 local_168;
  QSize local_160;
  QSize local_158;
  QSize local_150;
  QSize local_148;
  QIcon local_140 [4];
  QAction *local_120;
  undefined1 *local_118;
  uint local_10c;
  QIcon local_108;
  QAction *local_100;
  int local_f4 [5];
  undefined1 local_e0 [32];
  QWidget aQStack_c0 [3];
  undefined1 local_48 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar12 = q_func(in_RDI);
  if ((*(ushort *)&in_RDI->field_0x420 & 1) != 0) {
    QWidget::ensurePolished
              ((QWidget *)
               CONCAT26(in_stack_fffffffffffffc8e.ucs,
                        CONCAT24(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88)));
    QList<QAction_*>::size(&(in_RDI->super_QWidgetPrivate).actions);
    QList<QRect>::resize
              ((QList<QRect> *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
               (qsizetype)in_stack_fffffffffffffc68);
    QRect::QRect((QRect *)in_stack_fffffffffffffc60);
    QList<QRect>::fill((QList<QRect> *)
                       CONCAT17(in_stack_fffffffffffffca7,
                                CONCAT16(in_stack_fffffffffffffca6,
                                         CONCAT15(in_stack_fffffffffffffca5,
                                                  CONCAT14(in_stack_fffffffffffffca4,
                                                           CONCAT13(in_stack_fffffffffffffca3,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffffca2,
                                                  CONCAT11(in_stack_fffffffffffffca1,
                                                           in_stack_fffffffffffffca0))))))),
                       (parameter_type)in_stack_fffffffffffffc98,in_stack_fffffffffffffcd8);
    iVar4 = getLastVisibleAction
                      ((QMenuPrivate *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70)
                      );
    pQVar13 = QWidget::style((QWidget *)
                             CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
    memset(local_48,0xaa,0x40);
    QStyleOption::QStyleOption
              (in_stack_fffffffffffffc78,in_stack_fffffffffffffc74,in_stack_fffffffffffffc70);
    QStyleOption::initFrom
              (in_stack_fffffffffffffc78,
               (QWidget *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70));
    iVar5 = (**(code **)(*(long *)pQVar13 + 0xe0))(pQVar13,0x1c,local_48,pQVar12);
    iVar6 = (**(code **)(*(long *)pQVar13 + 0xe0))(pQVar13,0x1d,local_48,pQVar12);
    iVar7 = (**(code **)(*(long *)pQVar13 + 0xe0))(pQVar13,0x3e,local_48,pQVar12);
    iVar8 = (**(code **)(*(long *)pQVar13 + 0xe0))(pQVar13,0x1e,local_48,pQVar12);
    iVar9 = (**(code **)(*(long *)pQVar13 + 0xe0))(pQVar13,0x20,local_48,pQVar12);
    if ((*(ushort *)&in_RDI->field_0x420 >> 9 & 1) == 0) {
      local_344 = 0;
    }
    else {
      local_344 = (**(code **)(*(long *)pQVar13 + 0xe0))(pQVar13,0x1f,local_48,pQVar12);
    }
    if (in_RDI->scroll == (QMenuScroller *)0x0) {
      local_34c = 0;
    }
    else {
      local_34c = in_RDI->scroll->scrollOffset;
    }
    local_344 = iVar6 + iVar8 + (int)(in_RDI->super_QWidgetPrivate).topmargin + local_34c +
                local_344;
    iVar10 = QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
    iVar6 = (iVar10 + iVar9 * -2) - (iVar6 + (in_RDI->super_QWidgetPrivate).bottommargin + iVar8);
    local_f4[0] = 0;
    in_RDI->tabWidth = 0;
    in_RDI->maxIconWidth = 0;
    *(ushort *)&in_RDI->field_0x420 = *(ushort *)&in_RDI->field_0x420 & 0xfffd;
    in_RDI->ncols = '\x01';
    for (local_2d8 = 0; qVar14 = QList<QAction_*>::size(&(in_RDI->super_QWidgetPrivate).actions),
        local_2d8 < qVar14; local_2d8 = local_2d8 + 1) {
      ppQVar15 = QList<QAction_*>::at
                           ((QList<QAction_*> *)in_stack_fffffffffffffc60,
                            CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
      local_100 = *ppQVar15;
      uVar16 = QAction::isSeparator();
      if ((((uVar16 & 1) == 0) && (uVar16 = QAction::isVisible(), (uVar16 & 1) != 0)) &&
         (bVar1 = QHash<QAction_*,_QWidget_*>::contains
                            ((QHash<QAction_*,_QWidget_*> *)in_stack_fffffffffffffc68,
                             (QAction **)in_stack_fffffffffffffc60), !bVar1)) {
        bVar2 = QAction::isCheckable();
        *(ushort *)&in_RDI->field_0x420 =
             *(ushort *)&in_RDI->field_0x420 & 0xfffd |
             (ushort)((*(ushort *)&in_RDI->field_0x420 >> 1 & 1) != 0 || (bVar2 & 1) != 0) << 1;
        local_108.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
        QAction::icon();
        uVar16 = QIcon::isNull();
        if ((uVar16 & 1) == 0) {
          local_10c = iVar7 + 4;
          puVar17 = qMax<unsigned_int>(&in_RDI->maxIconWidth,&local_10c);
          in_RDI->maxIconWidth = *puVar17;
        }
        QIcon::~QIcon(&local_108);
      }
    }
    local_118 = &DAT_aaaaaaaaaaaaaaaa;
    QWidget::fontMetrics((QWidget *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
    local_2d9 = 1;
    bVar1 = isContextMenu((QMenuPrivate *)0x63fd31);
    pQVar18 = QWidget::style((QWidget *)
                             CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
    iVar7 = (**(code **)(*(long *)pQVar18 + 0xf0))(pQVar18,0x61,0,pQVar12);
    local_2d4 = local_344;
    for (local_2e0 = 0; local_2e0 <= iVar4; local_2e0 = local_2e0 + 1) {
      ppQVar15 = QList<QAction_*>::at
                           ((QList<QAction_*> *)in_stack_fffffffffffffc60,
                            CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
      local_120 = *ppQVar15;
      uVar11 = QAction::isSeparator();
      bVar3 = false;
      local_2e3 = false;
      bVar2 = 0;
      if ((uVar11 & 1) != 0) {
        QAction::text();
        bVar3 = true;
        local_2e3 = QString::isEmpty((QString *)0x63fe10);
        bVar2 = 1;
        if (local_2e3) {
          QAction::icon();
          bVar2 = QIcon::isNull();
          bVar2 = bVar2 ^ 0xff;
        }
      }
      if (local_2e3 != false) {
        QIcon::~QIcon(local_140);
      }
      if (bVar3) {
        QString::~QString((QString *)0x63fe91);
      }
      if (((bVar2 & 1) == 0) || (bVar27 = 1, iVar7 != 0)) {
        uVar11 = QAction::isSeparator();
        bVar27 = 0;
        if ((uVar11 & 1) != 0) {
          bVar27 = bVar2 & 1 ^ 0xff;
        }
      }
      uVar16 = QAction::isVisible();
      if (((uVar16 & 1) != 0) &&
         ((((*(ushort *)&in_RDI->field_0x420 >> 3 & 1) == 0 || (local_2d9 == 0)) ||
          ((bVar27 & 1) == 0)))) {
        memset(local_e0,0xaa,0x98);
        QStyleOptionMenuItem::QStyleOptionMenuItem((QStyleOptionMenuItem *)0x63ff70);
        (**(code **)(*(long *)&pQVar12->super_QWidget + 0x1a0))(pQVar12,local_e0,local_120);
        pQVar26 = aQStack_c0;
        local_148 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
        QSize::QSize((QSize *)in_stack_fffffffffffffc60);
        pQVar19 = QHash<QAction_*,_QWidget_*>::value
                            ((QHash<QAction_*,_QWidget_*> *)in_stack_fffffffffffffc68,
                             (QAction **)in_stack_fffffffffffffc60);
        if (pQVar19 == (QWidget *)0x0) {
          uVar11 = QAction::isSeparator();
          bVar2 = 0;
          if ((uVar11 & 1) != 0) {
            QAction::text();
            bVar2 = QString::isEmpty((QString *)0x640113);
            QString::~QString((QString *)0x640138);
          }
          if ((bVar2 & 1) == 0) {
            local_1b8 = &DAT_aaaaaaaaaaaaaaaa;
            local_1b0 = &DAT_aaaaaaaaaaaaaaaa;
            local_1a8 = &DAT_aaaaaaaaaaaaaaaa;
            QAction::text();
            QChar::QChar<char16_t,_true>(&local_1ba,L'\t');
            qVar14 = QString::indexOf((QString *)in_stack_fffffffffffffc68,in_stack_fffffffffffffc8e
                                      ,(qsizetype)in_stack_fffffffffffffc60,
                                      in_stack_fffffffffffffc5c);
            if (qVar14 == -1) {
              uVar16 = QAction::isShortcutVisibleInContextMenu();
              if (((uVar16 & 1) != 0) || (!bVar1)) {
                local_200[0] = &DAT_aaaaaaaaaaaaaaaa;
                QAction::shortcut();
                uVar16 = QKeySequence::isEmpty();
                if ((uVar16 & 1) == 0) {
                  local_204 = in_RDI->tabWidth;
                  QKeySequence::toString((SequenceFormat)local_220);
                  local_208 = QFontMetrics::horizontalAdvance((QString *)&local_118,(int)local_220);
                  puVar20 = (uint *)qMax<int>((int *)&local_204,&local_208);
                  in_RDI->tabWidth = *puVar20;
                  QString::~QString((QString *)0x640395);
                }
                QKeySequence::~QKeySequence((QKeySequence *)local_200);
              }
            }
            else {
              local_1c0 = in_RDI->tabWidth;
              QString::mid((longlong)local_1e0,(longlong)&local_1b8);
              local_1c4 = QFontMetrics::horizontalAdvance((QString *)&local_118,(int)local_1e0);
              puVar20 = (uint *)qMax<int>((int *)&local_1c0,&local_1c4);
              in_RDI->tabWidth = *puVar20;
              QString::~QString((QString *)0x640281);
              QString::left((QString *)in_stack_fffffffffffffc78,
                            CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70));
              QString::operator=((QString *)in_stack_fffffffffffffc60,
                                 (QString *)
                                 CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
              QString::~QString((QString *)0x6402c0);
            }
            QRect::QRect((QRect *)in_stack_fffffffffffffc60);
            auVar25 = QFontMetrics::boundingRect
                                ((QRect *)pQVar26,(int)local_240,(QString *)0x900,(int)&local_1b8,
                                 (int *)0x0);
            local_230 = auVar25;
            QRect::width((QRect *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
            QSize::setWidth((QSize *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c);
            local_244 = QFontMetrics::height();
            local_248 = QFontMetrics::height();
            qMax<int>(&local_244,&local_248);
            QSize::setHeight((QSize *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c);
            local_250.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
            QAction::icon();
            uVar16 = QIcon::isNull();
            if ((uVar16 & 1) == 0) {
              local_258 = &DAT_aaaaaaaaaaaaaaaa;
              QSize::QSize((QSize *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c,
                           in_stack_fffffffffffffc58);
              in_stack_fffffffffffffc94 = QSize::height((QSize *)0x6404c9);
              iVar9 = QSize::height((QSize *)0x6404da);
              if (iVar9 < in_stack_fffffffffffffc94) {
                QSize::height((QSize *)0x6404f1);
                QSize::setHeight((QSize *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c);
              }
            }
            QIcon::~QIcon(&local_250);
            QString::~QString((QString *)0x64051c);
            in_stack_fffffffffffffc98 = pQVar26;
          }
          else {
            QSize::QSize((QSize *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c,
                         in_stack_fffffffffffffc58);
            local_148 = local_1a0;
          }
          local_260 = (QSize)(**(code **)(*(long *)pQVar13 + 0xe8))(pQVar13,7,local_e0,&local_148);
          local_148 = local_260;
        }
        else {
          local_168 = (**(code **)(*(long *)pQVar19 + 0x70))();
          local_170 = QWidget::minimumSize
                                ((QWidget *)
                                 CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70));
          local_160 = QSize::expandedTo((QSize *)in_stack_fffffffffffffc68,
                                        (QSize *)in_stack_fffffffffffffc60);
          local_178 = (**(code **)(*(long *)pQVar19 + 0x78))();
          local_158 = QSize::expandedTo((QSize *)in_stack_fffffffffffffc68,
                                        (QSize *)in_stack_fffffffffffffc60);
          local_180 = QWidget::maximumSize
                                ((QWidget *)
                                 CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70));
          local_150 = QSize::boundedTo((QSize *)in_stack_fffffffffffffc68,
                                       (QSize *)in_stack_fffffffffffffc60);
          local_148 = local_150;
        }
        bVar3 = QSize::isEmpty((QSize *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70
                                                ));
        if (!bVar3) {
          local_264 = QSize::width((QSize *)0x640584);
          piVar21 = qMax<int>(local_f4,&local_264);
          local_f4[0] = *piVar21;
          if (in_RDI->scroll == (QMenuScroller *)0x0) {
            in_stack_fffffffffffffc90 = local_2d4;
            iVar9 = QSize::height((QSize *)0x6405d3);
            if (in_stack_fffffffffffffc90 + iVar9 <= iVar6) goto LAB_00640608;
            in_RDI->ncols = in_RDI->ncols + '\x01';
            local_2d4 = local_344;
          }
          else {
LAB_00640608:
            iVar9 = QSize::height((QSize *)0x640615);
            local_2d4 = iVar9 + local_2d4;
          }
          iVar9 = QSize::width((QSize *)0x640630);
          in_stack_fffffffffffffc8e.ucs = (char16_t)((uint)iVar9 >> 0x10);
          QSize::height((QSize *)0x640641);
          QRect::QRect(in_stack_fffffffffffffc68,(int)((ulong)in_stack_fffffffffffffc60 >> 0x20),
                       (int)in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c,
                       in_stack_fffffffffffffc58);
          pQVar22 = QList<QRect>::operator[]
                              ((QList<QRect> *)in_stack_fffffffffffffc60,
                               CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
          pQVar22->x1 = (Representation)(undefined4)local_274;
          pQVar22->y1 = (Representation)local_274._4_4_;
          pQVar22->x2 = (Representation)(undefined4)local_26c;
          pQVar22->y2 = (Representation)local_26c._4_4_;
        }
        QStyleOptionMenuItem::~QStyleOptionMenuItem(in_stack_fffffffffffffc60);
        local_2d9 = bVar27 & 1;
      }
    }
    local_f4[0] = in_RDI->tabWidth + local_f4[0];
    if (((*(ushort *)&in_RDI->field_0x420 >> 10 & 1) == 0) ||
       (in_RDI->scroll != (QMenuScroller *)0x0)) {
      QSize::QSize((QSize *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c,
                   in_stack_fffffffffffffc58);
      local_27c = (**(code **)(*(long *)pQVar13 + 0xe8))(pQVar13,10,local_48,local_284,pQVar12);
      iVar4 = QSize::width((QSize *)0x64074b);
      local_288 = QWidget::minimumWidth((QWidget *)in_stack_fffffffffffffc60);
      local_288 = local_288 -
                  (iVar4 + (in_RDI->super_QWidgetPrivate).leftmargin +
                   (int)(in_RDI->super_QWidgetPrivate).rightmargin + (iVar8 + iVar5) * 2);
      piVar21 = qMax<int>(&local_288,local_f4);
      local_f4[0] = *piVar21;
    }
    local_314 = 0;
    local_2d4 = local_344;
    while( true ) {
      lVar23 = (long)local_314;
      qVar14 = QList<QAction_*>::size(&(in_RDI->super_QWidgetPrivate).actions);
      if (qVar14 <= lVar23) break;
      QList<QRect>::operator[]
                ((QList<QRect> *)in_stack_fffffffffffffc60,
                 CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
      bVar1 = QRect::isNull((QRect *)in_stack_fffffffffffffc60);
      if (!bVar1) {
        if (in_RDI->scroll == (QMenuScroller *)0x0) {
          iVar4 = local_2d4;
          iVar5 = QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffc5c,
                                                  in_stack_fffffffffffffc58));
          if (iVar6 < iVar4 + iVar5) {
            local_2d4 = local_344;
          }
        }
        QRect::translate((QRect *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c,
                         in_stack_fffffffffffffc58);
        QRect::setWidth((QRect *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c);
        this_00 = &in_RDI->widgetItems;
        QList<QAction_*>::at
                  ((QList<QAction_*> *)in_stack_fffffffffffffc60,
                   CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
        pQVar24 = (QStyleOptionMenuItem *)
                  QHash<QAction_*,_QWidget_*>::value(this_00,(QAction **)in_stack_fffffffffffffc60);
        if (pQVar24 != (QStyleOptionMenuItem *)0x0) {
          in_stack_fffffffffffffc60 = pQVar24;
          QWidget::setGeometry
                    (in_stack_fffffffffffffc98,
                     (QRect *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90));
          QList<QAction_*>::at
                    ((QList<QAction_*> *)in_stack_fffffffffffffc60,
                     CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
          bVar2 = QAction::isVisible();
          (**(code **)(*(long *)&in_stack_fffffffffffffc60->super_QStyleOption + 0x68))
                    (in_stack_fffffffffffffc60,bVar2 & 1);
        }
        iVar4 = QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58)
                             );
        local_2d4 = iVar4 + local_2d4;
      }
      local_314 = local_314 + 1;
    }
    *(ushort *)&in_RDI->field_0x420 = *(ushort *)&in_RDI->field_0x420 & 0xfffe;
    QFontMetrics::~QFontMetrics((QFontMetrics *)&local_118);
    QStyleOption::~QStyleOption(&in_stack_fffffffffffffc60->super_QStyleOption);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMenuPrivate::updateActionRects(const QRect &screen) const
{
    Q_Q(const QMenu);
    if (!itemsDirty)
        return;

    q->ensurePolished();

    //let's reinitialize the buffer
    actionRects.resize(actions.size());
    actionRects.fill(QRect());

    int lastVisibleAction = getLastVisibleAction();

    QStyle *style = q->style();
    QStyleOption opt;
    opt.initFrom(q);
    const int hmargin = style->pixelMetric(QStyle::PM_MenuHMargin, &opt, q),
              vmargin = style->pixelMetric(QStyle::PM_MenuVMargin, &opt, q),
              icone = style->pixelMetric(QStyle::PM_SmallIconSize, &opt, q);
    const int fw = style->pixelMetric(QStyle::PM_MenuPanelWidth, &opt, q);
    const int deskFw = style->pixelMetric(QStyle::PM_MenuDesktopFrameWidth, &opt, q);
    const int tearoffHeight = tearoff ? style->pixelMetric(QStyle::PM_MenuTearoffHeight, &opt, q) : 0;
    const int base_y = vmargin + fw + topmargin + (scroll ? scroll->scrollOffset : 0) + tearoffHeight;
    const int column_max_y = screen.height() - 2 * deskFw - (vmargin + bottommargin + fw);
    int max_column_width = 0;
    int y = base_y;

    //for compatibility now - will have to refactor this away
    tabWidth = 0;
    maxIconWidth = 0;
    hasCheckableItems = false;
    ncols = 1;

    for (int i = 0; i < actions.size(); ++i) {
        QAction *action = actions.at(i);
        if (action->isSeparator() || !action->isVisible() || widgetItems.contains(action))
            continue;
        //..and some members
        hasCheckableItems |= action->isCheckable();
        QIcon is = action->icon();
        if (!is.isNull()) {
            maxIconWidth = qMax<uint>(maxIconWidth, icone + 4);
        }
    }

    //calculate size
    QFontMetrics qfm = q->fontMetrics();
    bool previousWasSeparator = true; // this is true to allow removing the leading separators
#if QT_CONFIG(shortcut)
    const bool contextMenu = isContextMenu();
#endif
    const bool menuSupportsSections = q->style()->styleHint(QStyle::SH_Menu_SupportsSections, nullptr, q);
    for(int i = 0; i <= lastVisibleAction; i++) {
        QAction *action = actions.at(i);
        const bool isSection = action->isSeparator() && (!action->text().isEmpty() || !action->icon().isNull());
        const bool isPlainSeparator = (isSection && !menuSupportsSections)
                                   || (action->isSeparator() && !isSection);

        if (!action->isVisible() ||
            (collapsibleSeparators && previousWasSeparator && isPlainSeparator))
            continue; // we continue, this action will get an empty QRect

        previousWasSeparator = isPlainSeparator;

        //let the style modify the above size..
        QStyleOptionMenuItem opt;
        q->initStyleOption(&opt, action);
        const QFontMetrics &fm = opt.fontMetrics;

        QSize sz;
        if (QWidget *w = widgetItems.value(action)) {
          sz = w->sizeHint().expandedTo(w->minimumSize()).expandedTo(w->minimumSizeHint()).boundedTo(w->maximumSize());
        } else {
            //calc what I think the size is..
            if (action->isSeparator() && action->text().isEmpty()) {
                sz = QSize(2, 2);
            } else {
                QString s = action->text();
                qsizetype t = s.indexOf(u'\t');
                if (t != -1) {
                    tabWidth = qMax(int(tabWidth), qfm.horizontalAdvance(s.mid(t+1)));
                    s = s.left(t);
#if QT_CONFIG(shortcut)
                } else if (action->isShortcutVisibleInContextMenu() || !contextMenu) {
                    QKeySequence seq = action->shortcut();
                    if (!seq.isEmpty())
                        tabWidth = qMax(int(tabWidth), qfm.horizontalAdvance(seq.toString(QKeySequence::NativeText)));
#endif
                }
                sz.setWidth(fm.boundingRect(QRect(), Qt::TextSingleLine | Qt::TextShowMnemonic, s).width());
                sz.setHeight(qMax(fm.height(), qfm.height()));

                QIcon is = action->icon();
                if (!is.isNull()) {
                    QSize is_sz = QSize(icone, icone);
                    if (is_sz.height() > sz.height())
                        sz.setHeight(is_sz.height());
                }
            }
            sz = style->sizeFromContents(QStyle::CT_MenuItem, &opt, sz, q);
        }


        if (!sz.isEmpty()) {
            max_column_width = qMax(max_column_width, sz.width());
            //wrapping
            if (!scroll && y + sz.height() > column_max_y) {
                ncols++;
                y = base_y;
            } else {
                y += sz.height();
            }
            //update the item
            actionRects[i] = QRect(0, 0, sz.width(), sz.height());
        }
    }

    max_column_width += tabWidth; //finally add in the tab width
    if (!tornoff || scroll) { // exclude non-scrollable tear-off menu since the tear-off menu has a fixed size
        const int sfcMargin = style->sizeFromContents(QStyle::CT_Menu, &opt, QSize(0, 0), q).width();
        const int min_column_width = q->minimumWidth() - (sfcMargin + leftmargin + rightmargin + 2 * (fw + hmargin));
        max_column_width = qMax(min_column_width, max_column_width);
    }

    //calculate position
    int x = hmargin + fw + leftmargin;
    y = base_y;

    for(int i = 0; i < actions.size(); i++) {
        QRect &rect = actionRects[i];
        if (rect.isNull())
            continue;
        if (!scroll && y + rect.height() > column_max_y) {
            x += max_column_width + hmargin;
            y = base_y;
        }
        rect.translate(x, y);                        //move
        rect.setWidth(max_column_width); //uniform width

        //we need to update the widgets geometry
        if (QWidget *widget = widgetItems.value(actions.at(i))) {
            widget->setGeometry(rect);
            widget->setVisible(actions.at(i)->isVisible());
        }

        y += rect.height();
    }
    itemsDirty = 0;
}